

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall
ClipperLib::Clipper::FixupFirstLefts3(Clipper *this,OutRec *OldOutRec,OutRec *NewOutRec)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ulong uVar3;
  long lVar4;
  OutRec *pOVar5;
  
  pp_Var1 = this->_vptr_Clipper;
  p_Var2 = pp_Var1[-3];
  lVar4 = *(long *)((long)&this->m_ClipType + (long)p_Var2);
  if (*(long *)(p_Var2 + (long)&(this->m_Maxima).
                                super__List_base<long_long,_std::allocator<long_long>_>) != lVar4) {
    uVar3 = 0;
    do {
      lVar4 = *(long *)(lVar4 + uVar3 * 8);
      for (pOVar5 = *(OutRec **)(lVar4 + 8); pOVar5 != (OutRec *)0x0; pOVar5 = pOVar5->FirstLeft) {
        if (pOVar5->Pts != (OutPt *)0x0) goto LAB_00113dff;
      }
      pOVar5 = (OutRec *)0x0;
LAB_00113dff:
      if ((pOVar5 == OldOutRec) && (*(long *)(lVar4 + 0x18) != 0)) {
        *(OutRec **)(lVar4 + 8) = NewOutRec;
        p_Var2 = pp_Var1[-3];
      }
      uVar3 = uVar3 + 1;
      lVar4 = *(long *)((long)&this->m_ClipType + (long)p_Var2);
    } while (uVar3 < (ulong)(*(long *)(p_Var2 + (long)&(this->m_Maxima).
                                                                                                              
                                                  super__List_base<long_long,_std::allocator<long_long>_>
                                      ) - lVar4 >> 3));
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts3(OutRec* OldOutRec, OutRec* NewOutRec)
{
  //reassigns FirstLeft WITHOUT testing if NewOutRec contains the polygon
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (outRec->Pts && firstLeft == OldOutRec)
      outRec->FirstLeft = NewOutRec;
  }
}